

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O0

void cycle_value_do_proc(Am_Object *command_obj)

{
  unsigned_short uVar1;
  Am_Value *pAVar2;
  int local_38;
  int cur_val;
  undefined1 local_20 [4];
  int len;
  Am_Value_List labels;
  Am_Object *command_obj_local;
  
  labels.item = (Am_List_Item *)command_obj;
  pAVar2 = Am_Object::Get(command_obj,0x1aa,0);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_20,pAVar2);
  uVar1 = Am_Value_List::Length((Am_Value_List *)local_20);
  pAVar2 = Am_Object::Get(command_obj,0x1d4,0);
  local_38 = Am_Value::operator_cast_to_int(pAVar2);
  Am_Object::Set(command_obj,0x16c,local_38,0);
  if (uVar1 == 0) {
    Am_Object::Set(command_obj,0x169,0,0);
  }
  else {
    local_38 = local_38 + 1;
    if ((int)(uint)uVar1 <= local_38) {
      local_38 = 0;
    }
    Am_Object::Set(command_obj,0x169,local_38,0);
  }
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_20);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, cycle_value_do,
                 (Am_Object command_obj))
{
  Am_Value_List labels = command_obj.Get(Am_LABEL_LIST);
  int len = labels.Length();
  int cur_val = command_obj.Get(Am_COMPUTE_INTER_VALUE);
  command_obj.Set(Am_OLD_VALUE, cur_val);
  if (len == 0) {
    command_obj.Set(Am_VALUE, 0); //Am_COMPUTE_INTER_VALUE will be set
                                  //by formula
  } else {
    cur_val++;
    if (cur_val >= len)
      cur_val = 0;
    command_obj.Set(Am_VALUE, cur_val); //Am_COMPUTE_INTER_VALUE will be set by
                                        //cycle_value_get_string formula
  }
}